

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefaultSkewItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultSkewItemSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::ClockingDirectionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ClockingDirectionSyntax *args_2,Token *args_3)

{
  Token semi;
  DefaultSkewItemSyntax *direction;
  undefined8 in_RCX;
  Token *in_RDX;
  undefined8 *in_R8;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  direction = (DefaultSkewItemSyntax *)
              allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                      );
  semi.info = (Info *)in_RDX;
  semi.kind = (short)in_RCX;
  semi._2_1_ = (char)((ulong)in_RCX >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RCX >> 0x18);
  semi.rawLen = (int)((ulong)in_RCX >> 0x20);
  slang::syntax::DefaultSkewItemSyntax::DefaultSkewItemSyntax
            ((DefaultSkewItemSyntax *)in_R8[1],
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_R8,*in_RDX,
             (ClockingDirectionSyntax *)direction,semi);
  return direction;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }